

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O1

void __thiscall wasm::TypeBuilder::createRecGroup(TypeBuilder *this,size_t index,size_t length)

{
  _Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false> _Var1;
  long lVar2;
  iterator __position;
  ulong uVar3;
  size_t sVar4;
  pointer *__ptr;
  long lVar5;
  HeapType local_48;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *local_40;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *local_38;
  __single_object groupInfo;
  
  _Var1._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
       .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl;
  uVar3 = (long)*(pointer *)((long)&(_Var1._M_head_impl)->entries + 8) -
          *(long *)&((_Var1._M_head_impl)->entries).
                    super__Vector_base<wasm::TypeBuilder::Impl::Entry,_std::allocator<wasm::TypeBuilder::Impl::Entry>_>
          >> 4;
  if ((index <= uVar3) && (length + index <= uVar3)) {
    if (1 < length) {
      local_38 = (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)operator_new(0x18);
      (local_38->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (local_38->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (local_38->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::reserve(local_38,length);
      lVar5 = index << 4;
      sVar4 = 0;
      do {
        lVar2 = *(long *)&(((this->impl)._M_t.
                            super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                            .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl)->
                          entries).
                          super__Vector_base<wasm::TypeBuilder::Impl::Entry,_std::allocator<wasm::TypeBuilder::Impl::Entry>_>
        ;
        if (*(long *)(*(long *)(lVar2 + lVar5) + 0x20) != 0) {
          __assert_fail("info->recGroup == nullptr && \"group already assigned\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                        ,0x93b,"void wasm::TypeBuilder::createRecGroup(size_t, size_t)");
        }
        local_48.id = *(uintptr_t *)(lVar2 + lVar5);
        __position._M_current =
             (local_38->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl
             .super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (local_38->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::
          _M_realloc_insert<wasm::HeapType>(local_38,__position,&local_48);
        }
        else {
          (__position._M_current)->id = local_48.id;
          (local_38->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        *(vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> **)
         (*(long *)(lVar2 + lVar5) + 0x20) = local_38;
        *(size_t *)(*(long *)(lVar2 + lVar5) + 0x28) = sVar4;
        sVar4 = sVar4 + 1;
        lVar5 = lVar5 + 0x10;
      } while (length != sVar4);
      local_48.id = (uintptr_t)local_38;
      local_40 = local_38;
      local_38 = (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)0x0;
      std::
      _Hashtable<wasm::RecGroup,std::pair<wasm::RecGroup_const,std::unique_ptr<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,std::default_delete<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>>,std::allocator<std::pair<wasm::RecGroup_const,std::unique_ptr<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,std::default_delete<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>>>,std::__detail::_Select1st,std::equal_to<wasm::RecGroup>,std::hash<wasm::RecGroup>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_emplace<std::pair<wasm::RecGroup_const,std::unique_ptr<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,std::default_delete<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>>>
                ((_Hashtable<wasm::RecGroup,std::pair<wasm::RecGroup_const,std::unique_ptr<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,std::default_delete<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>>,std::allocator<std::pair<wasm::RecGroup_const,std::unique_ptr<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,std::default_delete<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>>>,std::__detail::_Select1st,std::equal_to<wasm::RecGroup>,std::hash<wasm::RecGroup>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&((this->impl)._M_t.
                      super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>
                      .super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl)->
                     recGroups,&local_48);
      if (local_40 != (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)0x0) {
        std::default_delete<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>::
        operator()((default_delete<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_> *)
                   &local_40,local_40);
      }
      if (local_38 != (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)0x0) {
        std::default_delete<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>::
        operator()((default_delete<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_> *)
                   &local_38,local_38);
      }
    }
    return;
  }
  __assert_fail("index <= size() && index + length <= size() && \"group out of bounds\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-type.cpp"
                ,0x932,"void wasm::TypeBuilder::createRecGroup(size_t, size_t)");
}

Assistant:

void TypeBuilder::createRecGroup(size_t index, size_t length) {
  assert(index <= size() && index + length <= size() && "group out of bounds");
  // Only materialize nontrivial recursion groups.
  if (length < 2) {
    return;
  }
  auto groupInfo = std::make_unique<RecGroupInfo>();
  groupInfo->reserve(length);
  for (size_t i = 0; i < length; ++i) {
    auto& info = impl->entries[index + i].info;
    assert(info->recGroup == nullptr && "group already assigned");
    groupInfo->push_back(asHeapType(info));
    info->recGroup = groupInfo.get();
    info->recGroupIndex = i;
  }
  impl->recGroups.insert(
    {RecGroup(uintptr_t(groupInfo.get())), std::move(groupInfo)});
}